

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O3

bool sect_IsSizeKnown(Section *sect)

{
  int iVar1;
  bool bVar2;
  SectionStackEntry *pSVar3;
  
  if (sect->modifier == SECTION_NORMAL) {
    bVar2 = false;
    if ((currentSection != sect) && (bVar2 = false, currentLoadSection != sect)) {
      bVar2 = true;
      for (pSVar3 = sectionStack; pSVar3 != (SectionStackEntry *)0x0; pSVar3 = pSVar3->next) {
        if (pSVar3->section != (Section *)0x0) {
          iVar1 = strcmp(sect->name,pSVar3->section->name);
          if (iVar1 == 0) goto LAB_00113abd;
        }
      }
    }
  }
  else {
LAB_00113abd:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool sect_IsSizeKnown(struct Section const NONNULL(sect))
{
	// SECTION UNION and SECTION FRAGMENT can still grow
	if (sect->modifier != SECTION_NORMAL)
		return false;

	// The current section (or current load section if within one) is still growing
	if (sect == currentSection || sect == currentLoadSection)
		return false;

	// Any section on the stack is still growing
	for (struct SectionStackEntry *stack = sectionStack; stack; stack = stack->next) {
		if (stack->section && !strcmp(sect->name, stack->section->name))
			return false;
	}

	return true;
}